

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

istream * operator>>(istream *in,Matrix *matrix)

{
  istream *this;
  Fraction *f;
  int i;
  int i_00;
  int j;
  int j_00;
  int m;
  int n;
  int local_50;
  int local_4c;
  Matrix local_48;
  
  this = (istream *)std::istream::operator>>((istream *)in,&local_4c);
  std::istream::operator>>(this,&local_50);
  Matrix::Matrix(&local_48,local_4c,local_50,0);
  Matrix::operator=(matrix,&local_48);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_48.elements_);
  for (i_00 = 0; i_00 < local_4c; i_00 = i_00 + 1) {
    for (j_00 = 0; j_00 < local_50; j_00 = j_00 + 1) {
      f = Matrix::At(matrix,i_00,j_00);
      operator>>(in,f);
    }
  }
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, Matrix& matrix) {
  int n, m;
  in >> n >> m;

  matrix = Matrix(n, m);
  for (int i = 0; i < n; ++i) {
    for (int j = 0; j < m; ++j) {
      in >> matrix.At(i, j);
    }
  }

  return in;
}